

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql.cpp
# Opt level: O2

void extract_cond_isotree
               (IsoForest *model,IsoTree *tree,string *cond_left,string *cond_right,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *numeric_colnames,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *categ_colnames,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *categ_levels)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  IsoTree *pIVar5;
  string *psVar6;
  runtime_error *this;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  IsoTree *local_158;
  string *local_150;
  allocator<char> local_144;
  allocator<char> local_143;
  allocator<char> local_142;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string *local_c0;
  IsoForest *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_158 = (IsoTree *)numeric_colnames;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"",(allocator<char> *)&local_178);
  local_150 = cond_left;
  std::__cxx11::string::operator=((string *)cond_left,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"",(allocator<char> *)&local_178);
  std::__cxx11::string::operator=((string *)cond_right,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  pIVar5 = local_158;
  if (tree->tree_left == 0) {
    return;
  }
  local_b8 = model;
  if (tree->col_type == Categorical) {
    local_158 = tree;
    if (model->cat_split_type == SubSet) {
      std::operator+(&local_100,
                     (categ_colnames->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + tree->col_num," IN (");
      psVar6 = local_150;
      std::__cxx11::string::operator=((string *)local_150,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::_M_assign((string *)cond_right);
      pIVar5 = local_158;
      if (model->missing_action == Impute) {
        if (0.5 <= local_158->pct_tree_left) {
          std::operator+(&local_178,
                         (categ_colnames->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_158->col_num,
                         " IS NULL OR ");
          std::operator+(&local_100,&local_178,psVar6);
          std::__cxx11::string::operator=((string *)psVar6,(string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_178);
          std::operator+(&local_178,
                         (categ_colnames->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + pIVar5->col_num,
                         " IS NOT NULL AND ");
          std::operator+(&local_100,&local_178,cond_right);
        }
        else {
          std::operator+(&local_178,
                         (categ_colnames->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_158->col_num,
                         " IS NOT NULL AND ");
          std::operator+(&local_100,&local_178,psVar6);
          std::__cxx11::string::operator=((string *)psVar6,(string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_178);
          std::operator+(&local_178,
                         (categ_colnames->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + pIVar5->col_num," IS NULL OR "
                        );
          std::operator+(&local_100,&local_178,cond_right);
        }
        std::__cxx11::string::operator=((string *)cond_right,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_178);
      }
      lVar8 = 0;
      bVar3 = false;
      bVar4 = false;
      uVar9 = 0;
      local_c0 = cond_right;
      do {
        pcVar2 = (local_158->cat_split).
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_158->cat_split).
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pcVar2) <= uVar9) {
          if (bVar3) {
            std::__cxx11::string::append((char *)local_150);
          }
          else {
            std::__cxx11::string::assign((char *)local_150);
          }
          if (bVar4) {
            std::__cxx11::string::append((char *)local_c0);
            return;
          }
          std::__cxx11::string::assign((char *)local_c0);
          return;
        }
        cVar1 = pcVar2[uVar9];
        if (cVar1 == '\0') {
          pcVar7 = "";
          if (bVar4) {
            pcVar7 = ", ";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,pcVar7,(allocator<char> *)&local_e0);
          std::operator+(&local_120,&local_140,"\'");
          std::operator+(&local_178,&local_120,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)&(categ_levels->
                                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[local_158->col_num].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + lVar8));
          std::operator+(&local_100,&local_178,"\'");
          std::__cxx11::string::append((string *)local_c0);
LAB_00312601:
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          bVar4 = true;
        }
        else if (cVar1 == -1) {
          if (local_b8->missing_action == Impute || local_b8->new_cat_action == Smallest) {
            if (((local_b8->new_cat_action != Smallest) || (0.5 <= local_158->pct_tree_left)) &&
               ((local_b8->missing_action != Impute || (local_158->pct_tree_left < 0.5)))) {
              pcVar7 = "";
              if (bVar4) {
                pcVar7 = ", ";
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_140,pcVar7,(allocator<char> *)&local_e0);
              std::operator+(&local_120,&local_140,"\'");
              std::operator+(&local_178,&local_120,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (*(long *)&(categ_levels->
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start
                                        [local_158->col_num].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar8));
              std::operator+(&local_100,&local_178,"\'");
              std::__cxx11::string::append((string *)local_c0);
              goto LAB_00312601;
            }
            pcVar7 = "";
            if (bVar3) {
              pcVar7 = ", ";
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_140,pcVar7,(allocator<char> *)&local_e0);
            std::operator+(&local_120,&local_140,"\'");
            std::operator+(&local_178,&local_120,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)&(categ_levels->
                                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[local_158->col_num]
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + lVar8));
            std::operator+(&local_100,&local_178,"\'");
            std::__cxx11::string::append((string *)local_150);
            goto LAB_0031253d;
          }
        }
        else if (cVar1 == '\x01') {
          pcVar7 = "";
          if (bVar3) {
            pcVar7 = ", ";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,pcVar7,(allocator<char> *)&local_e0);
          std::operator+(&local_120,&local_140,"\'");
          std::operator+(&local_178,&local_120,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)&(categ_levels->
                                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[local_158->col_num].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + lVar8));
          std::operator+(&local_100,&local_178,"\'");
          std::__cxx11::string::append((string *)local_150);
LAB_0031253d:
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          bVar3 = true;
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x20;
      } while( true );
    }
    if (model->cat_split_type != SingleCateg) {
      return;
    }
    if (model->missing_action == Impute) {
      pcVar7 = " IS NULL OR ";
      if (tree->pct_tree_left < 0.5) {
        pcVar7 = " IS NOT NULL AND ";
      }
      std::operator+(&local_e0,
                     (categ_colnames->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + tree->col_num,pcVar7);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"",(allocator<char> *)&local_90);
    }
    psVar6 = local_150;
    std::operator+(&local_140,&local_e0,
                   (categ_colnames->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + tree->col_num);
    std::operator+(&local_120,&local_140," = \'");
    std::operator+(&local_178,&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)tree->chosen_cat * 0x20 +
                   *(long *)&(categ_levels->
                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[tree->col_num].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data));
    std::operator+(&local_100,&local_178,"\'");
    std::__cxx11::string::operator=((string *)psVar6,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_e0);
    pIVar5 = local_158;
    if (local_b8->missing_action == Impute) {
      pcVar7 = " IS NOT NULL AND ";
      if (local_158->pct_tree_left < 0.5) {
        pcVar7 = " IS NULL OR ";
      }
      std::operator+(&local_e0,
                     (categ_colnames->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + local_158->col_num,pcVar7);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"",(allocator<char> *)&local_b0);
    }
    std::operator+(&local_140,&local_e0,
                   (categ_colnames->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + pIVar5->col_num);
    std::operator+(&local_120,&local_140," != \'");
    std::operator+(&local_178,&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)pIVar5->chosen_cat * 0x20 +
                   *(long *)&(categ_levels->
                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[pIVar5->col_num].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data));
    std::operator+(&local_100,&local_178,"\'");
    std::__cxx11::string::operator=((string *)cond_right,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    this_00 = &local_e0;
  }
  else {
    if (tree->col_type != Numeric) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"Unexpected error in ",&local_141);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/sql.cpp"
                 ,&local_142);
      std::operator+(&local_140,&local_e0,&local_90);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,":",&local_143);
      std::operator+(&local_120,&local_140,&local_b0);
      std::__cxx11::to_string(&local_50,0x218);
      std::operator+(&local_178,&local_120,&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                 ,&local_144);
      std::operator+(&local_100,&local_178,&local_70);
      std::runtime_error::runtime_error(this,(string *)&local_100);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (model->missing_action == Impute) {
      pcVar7 = " IS NULL OR ";
      if (tree->pct_tree_left < 0.5) {
        pcVar7 = " IS NOT NULL AND ";
      }
      std::operator+(&local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (tree->col_num * 0x20 + *(long *)local_158),pcVar7);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"",(allocator<char> *)&local_90);
    }
    psVar6 = local_150;
    std::operator+(&local_120,&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (tree->col_num * 0x20 + *(long *)pIVar5));
    std::operator+(&local_178,&local_120," <= ");
    std::__cxx11::to_string(&local_e0,tree->num_split);
    std::operator+(&local_100,&local_178,&local_e0);
    std::__cxx11::string::operator=((string *)psVar6,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    if (local_b8->missing_action == Impute) {
      pcVar7 = " IS NOT NULL AND ";
      if (tree->pct_tree_left < 0.5) {
        pcVar7 = " IS NULL OR ";
      }
      std::operator+(&local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (tree->col_num * 0x20 + *(long *)pIVar5),pcVar7);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"",(allocator<char> *)&local_b0);
    }
    std::operator+(&local_120,&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (tree->col_num * 0x20 + *(long *)pIVar5));
    std::operator+(&local_178,&local_120," > ");
    std::__cxx11::to_string(&local_e0,tree->num_split);
    std::operator+(&local_100,&local_178,&local_e0);
    std::__cxx11::string::operator=((string *)cond_right,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_120);
    this_00 = &local_140;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void extract_cond_isotree(const IsoForest &model, const IsoTree &tree,
                          std::string &cond_left, std::string &cond_right,
                          const std::vector<std::string> &numeric_colnames,
                          const std::vector<std::string> &categ_colnames,
                          const std::vector<std::vector<std::string>> &categ_levels)
{
    cond_left = std::string("");
    cond_right = std::string("");
    // if (tree.score >= 0.)
    if (tree.tree_left == 0)
        return;

    switch(tree.col_type)
    {
        case Numeric:
        {
            cond_left = ((model.missing_action != Impute)? "" :
                            ((tree.pct_tree_left >= .5)?
                                (numeric_colnames[tree.col_num]
                                    + " IS NULL OR ")
                                :
                                (numeric_colnames[tree.col_num]
                                    + " IS NOT NULL AND ")))
                            + numeric_colnames[tree.col_num]
                            + " <= "
                            + std::to_string(tree.num_split);
            cond_right = ((model.missing_action != Impute)? "" :
                            ((tree.pct_tree_left >= .5)?
                                (numeric_colnames[tree.col_num]
                                    + " IS NOT NULL AND ")
                                :
                                (numeric_colnames[tree.col_num]
                                    + " IS NULL OR ")))
                            + numeric_colnames[tree.col_num]
                            + " > "
                            + std::to_string(tree.num_split);
            break;
        }

        case Categorical:
        {
            switch(model.cat_split_type)
            {
                case SingleCateg:
                {
                    cond_left = ((model.missing_action != Impute)? "" :
                                    ((model.missing_action == Impute && tree.pct_tree_left >= .5)?
                                        (categ_colnames[tree.col_num]
                                            + " IS NULL OR ")
                                        :
                                        (categ_colnames[tree.col_num]
                                            + " IS NOT NULL AND ")))
                                    + categ_colnames[tree.col_num]
                                    + " = '"
                                    + categ_levels[tree.col_num][tree.chosen_cat]
                                    + "'";
                    cond_right = ((model.missing_action != Impute)? "" :
                                    ((model.missing_action == Impute && tree.pct_tree_left >= .5)?
                                        (categ_colnames[tree.col_num]
                                            + " IS NOT NULL AND ")
                                        :
                                        (categ_colnames[tree.col_num]
                                            + " IS NULL OR ")))
                                    + categ_colnames[tree.col_num]
                                    + " != '"
                                    + categ_levels[tree.col_num][tree.chosen_cat]
                                    + "'";
                    break;
                }

                case SubSet:
                {
                    cond_left = categ_colnames[tree.col_num] + " IN (";
                    cond_right = cond_left;
                    if (model.missing_action == Impute)
                    {
                        if (tree.pct_tree_left >= .5)
                        {
                            cond_left = categ_colnames[tree.col_num] + " IS NULL OR " + cond_left;
                            cond_right = categ_colnames[tree.col_num] + " IS NOT NULL AND " + cond_right;
                        }

                        else
                        {
                            cond_left = categ_colnames[tree.col_num] + " IS NOT NULL AND " + cond_left;
                            cond_right = categ_colnames[tree.col_num] + " IS NULL OR " + cond_right;
                        }
                    }
                    bool added_left = false;
                    bool added_right = false;
                    for (size_t categ = 0; categ < tree.cat_split.size(); categ++)
                    {
                        switch(tree.cat_split[categ])
                        {
                            case 1:
                            {
                                cond_left.append(
                                    std::string((added_left)? ", " : "")
                                    + "'"
                                    + categ_levels[tree.col_num][categ]
                                    + "'"
                                );
                                added_left = true;
                                break;
                            }

                            case 0:
                            {
                                cond_right.append(
                                    std::string((added_right)? ", " : "")
                                    + "'"
                                    + categ_levels[tree.col_num][categ]
                                    + "'"
                                );
                                added_right = true;
                                break;
                            }

                            case -1:
                            {
                                if (model.new_cat_action == Smallest || model.missing_action == Impute)
                                {
                                    if ((model.new_cat_action == Smallest && tree.pct_tree_left < .5) ||
                                        (model.missing_action == Impute && tree.pct_tree_left >= .5))
                                    {
                                        cond_left.append(
                                            std::string((added_left)? ", " : "")
                                            + "'"
                                            + categ_levels[tree.col_num][categ]
                                            + "'"
                                        );
                                        added_left = true;
                                    }
                                    else
                                    {
                                        cond_right.append(
                                            std::string((added_right)? ", " : "")
                                            + "'"
                                            + categ_levels[tree.col_num][categ]
                                            + "'"
                                        );
                                        added_right = true;
                                    }
                                }
                                break;
                            }
                        }
                    }
                    if (added_left)
                        cond_left += ")";
                    else
                        cond_left = "";
                    if (added_right)
                        cond_right += ")";
                    else
                        cond_right = "";

                    break;
                }
            }
            break;
        }

        default:
        {
            unexpected_error();
            break;
        }
    }
}